

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O3

void uuencode_group(char *_in,char *out)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uchar *in;
  uint uVar5;
  
  bVar1 = *_in;
  bVar2 = _in[1];
  bVar3 = _in[2];
  cVar4 = (bVar1 >> 2) + 0x20;
  if (bVar1 < 4) {
    cVar4 = '`';
  }
  *out = cVar4;
  uVar5 = ((uint)bVar2 * 0x100 | (uint)bVar1 << 0x10) >> 0xc & 0x3f;
  cVar4 = (char)uVar5 + ' ';
  if (uVar5 == 0) {
    cVar4 = '`';
  }
  out[1] = cVar4;
  uVar5 = (uint)bVar2 * 0x100 + (uint)bVar3 >> 6 & 0x3f;
  cVar4 = (char)uVar5 + ' ';
  if (uVar5 == 0) {
    cVar4 = '`';
  }
  out[2] = cVar4;
  cVar4 = (bVar3 & 0x3f) + 0x20;
  if ((bVar3 & 0x3f) == 0) {
    cVar4 = '`';
  }
  out[3] = cVar4;
  return;
}

Assistant:

static void
uuencode_group(const char _in[3], char out[4])
{
	const unsigned char *in = (const unsigned char *)_in;
	int t;

	t = (in[0] << 16) | (in[1] << 8) | in[2];
	out[0] = UUENC( 0x3f & (t >> 18) );
	out[1] = UUENC( 0x3f & (t >> 12) );
	out[2] = UUENC( 0x3f & (t >> 6) );
	out[3] = UUENC( 0x3f & t );
}